

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

char * add_unbounded_bin_str(char *a,char *b)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *__s;
  size_t sVar6;
  size_t sVar7;
  char *a_00;
  char *in_RSI;
  char *in_RDI;
  char *q;
  char *p;
  uint32_t rlen;
  uint32_t blen;
  uint32_t alen;
  char *tmp;
  char s;
  char y;
  char x;
  char c;
  char *r;
  char *res;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *local_58;
  char *local_50;
  byte local_29;
  char *local_28;
  char *local_20;
  char *local_8;
  
  pcVar5 = strip_zeroes(in_RDI);
  __s = strip_zeroes(in_RSI);
  if (*pcVar5 == '\0') {
    local_8 = btor2parser_strdup((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0));
  }
  else if (*__s == '\0') {
    local_8 = btor2parser_strdup((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0));
  }
  else {
    sVar6 = strlen(pcVar5);
    uVar3 = (uint)sVar6;
    sVar7 = strlen(__s);
    if (uVar3 < (uint)sVar7) {
      uVar3 = (uint)sVar7;
    }
    uVar4 = uVar3 + 1;
    a_00 = (char *)btor2parser_malloc(CONCAT44(uVar3,in_stack_ffffffffffffffa0));
    local_50 = pcVar5 + (sVar6 & 0xffffffff);
    local_58 = __s + (sVar7 & 0xffffffff);
    local_29 = 0x30;
    a_00[uVar4] = '\0';
    local_28 = a_00 + uVar4;
    while (a_00 < local_28) {
      if (pcVar5 < local_50) {
        in_stack_ffffffffffffffa0 = (int)local_50[-1];
        local_50 = local_50 + -1;
      }
      else {
        in_stack_ffffffffffffffa0 = 0x30;
      }
      if (__s < local_58) {
        bVar1 = local_58[-1];
        local_58 = local_58 + -1;
      }
      else {
        bVar1 = 0x30;
      }
      bVar2 = (byte)in_stack_ffffffffffffffa0 ^ bVar1 ^ local_29;
      local_29 = (byte)in_stack_ffffffffffffffa0 & (bVar1 | local_29) | bVar1 & local_29;
      local_28[-1] = bVar2;
      local_28 = local_28 + -1;
    }
    pcVar5 = strip_zeroes(a_00);
    local_20 = a_00;
    if (pcVar5 != a_00) {
      local_20 = btor2parser_strdup((char *)CONCAT44(uVar3,in_stack_ffffffffffffffa0));
      if (local_20 == (char *)0x0) {
        free(a_00);
        return (char *)0x0;
      }
      free(a_00);
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static char *
add_unbounded_bin_str (const char *a, const char *b)
{
  assert (a);
  assert (b);
  assert (is_bin_str (a));
  assert (is_bin_str (b));

  char *res, *r, c, x, y, s, *tmp;
  uint32_t alen, blen, rlen;
  const char *p, *q;

  a = strip_zeroes (a);
  b = strip_zeroes (b);

  if (!*a) return btor2parser_strdup (b);
  if (!*b) return btor2parser_strdup (a);

  alen = strlen (a);
  blen = strlen (b);
  rlen = (alen < blen) ? blen : alen;
  rlen++;

  res = btor2parser_malloc (rlen + 1);

  p = a + alen;
  q = b + blen;

  c = '0';

  r  = res + rlen;
  *r = 0;

  while (res < r)
  {
    x    = (a < p) ? *--p : '0';
    y    = (b < q) ? *--q : '0';
    s    = x ^ y ^ c;
    c    = (x & y) | (x & c) | (y & c);
    *--r = s;
  }

  p = strip_zeroes (res);
  if ((p != res))
  {
    tmp = btor2parser_strdup (p);
    if (!tmp)
    {
      free (res);
      return 0;
    }
    free (res);
    res = tmp;
  }

  return res;
}